

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

int list_find(ListNode *head,void *value,EqualityFunction equal_func,ListNode **output)

{
  int iVar1;
  ListNode *pLVar2;
  
  pLVar2 = head;
  if (head == (ListNode *)0x0) {
    cm_print_error("%s\n","head");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x2ae);
  }
  do {
    pLVar2 = pLVar2->next;
    if (pLVar2 == head) {
      return 0;
    }
    iVar1 = strcmp(*pLVar2->value,(char *)value);
  } while (iVar1 != 0);
  *(ListNode **)equal_func = pLVar2;
  return 1;
}

Assistant:

static int list_find(ListNode * const head, const void *value,
                     const EqualityFunction equal_func, ListNode **output) {
    ListNode *current;
    assert_non_null(head);
    for (current = head->next; current != head; current = current->next) {
        if (equal_func(current->value, value)) {
            *output = current;
            return 1;
        }
    }
    return 0;
}